

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QAbstractNativeEventFilter_*>::begin(QList<QAbstractNativeEventFilter_*> *this)

{
  QAbstractNativeEventFilter **n;
  QArrayDataPointer<QAbstractNativeEventFilter_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QAbstractNativeEventFilter_*> *)0x32ce49);
  QArrayDataPointer<QAbstractNativeEventFilter_*>::operator->(in_RDI);
  n = QArrayDataPointer<QAbstractNativeEventFilter_*>::begin
                ((QArrayDataPointer<QAbstractNativeEventFilter_*> *)0x32ce5a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }